

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgssvx.c
# Opt level: O0

void cgssvx(superlu_options_t *options,SuperMatrix *A,int *perm_c,int *perm_r,int *etree,char *equed
           ,float *R,float *C,SuperMatrix *L,SuperMatrix *U,void *work,int_t lwork,SuperMatrix *B,
           SuperMatrix *X,float *recip_pivot_growth,float *rcond,float *ferr,float *berr,
           GlobalLU_t *Glu,mem_usage_t *mem_usage,SuperLUStat_t *stat,int_t *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  yes_no_t yVar4;
  int *piVar5;
  int *piVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  int_t *piVar10;
  int iVar11;
  int relax_00;
  int iVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  int local_164;
  int local_15c;
  float local_154;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  float local_138;
  float local_134;
  float local_130;
  NRformat *Astore;
  double *utime;
  double t0;
  int panel_size;
  int relax;
  float rcmin;
  float rcmax;
  float rowcnd;
  float colcnd;
  float smlnum;
  float bignum;
  float anorm;
  float amax;
  int info1;
  int j;
  int i;
  colperm_t cStack_d0;
  char norm [1];
  trans_t trant;
  int permc_spec;
  int rowequ;
  int notran;
  int nofact;
  int equil;
  int colequ;
  SuperMatrix AC;
  SuperMatrix *AA;
  int nrhs;
  int ldx;
  int ldb;
  singlecomplex *Xmat;
  singlecomplex *Bmat;
  DNformat *Xstore;
  DNformat *Bstore;
  char *equed_local;
  int *etree_local;
  int *perm_r_local;
  int *perm_c_local;
  SuperMatrix *A_local;
  superlu_options_t *options_local;
  
  piVar5 = (int *)B->Store;
  piVar6 = (int *)X->Store;
  lVar7 = *(long *)(piVar5 + 2);
  lVar8 = *(long *)(piVar6 + 2);
  iVar1 = *piVar5;
  iVar2 = *piVar6;
  iVar3 = B->ncol;
  *info = 0;
  bVar13 = options->Fact != FACTORED;
  yVar4 = options->Equil;
  bVar14 = options->Trans == NOTRANS;
  if (bVar13) {
    *equed = 'N';
    bVar15 = false;
    bVar16 = false;
  }
  else {
    iVar11 = strncmp(equed,"R",1);
    bVar15 = true;
    if (iVar11 != 0) {
      iVar11 = strncmp(equed,"B",1);
      bVar15 = iVar11 == 0;
    }
    iVar11 = strncmp(equed,"C",1);
    bVar16 = true;
    if (iVar11 != 0) {
      iVar11 = strncmp(equed,"B",1);
      bVar16 = iVar11 == 0;
    }
    rowcnd = smach("Safe minimum");
    colcnd = 1.0 / rowcnd;
  }
  if ((((((options->Fact == DOFACT) || (options->Fact == SamePattern)) ||
        (options->Fact == SamePattern_SameRowPerm)) || (options->Fact == FACTORED)) &&
      (((options->Trans == NOTRANS || (options->Trans == TRANS)) || (options->Trans == CONJ)))) &&
     ((options->Equil == NO || (options->Equil == YES)))) {
    if ((((A->nrow == A->ncol) && (-1 < A->nrow)) && ((A->Stype == SLU_NC || (A->Stype == SLU_NR))))
       && ((A->Dtype == SLU_C && (A->Mtype == SLU_GE)))) {
      if ((((options->Fact != FACTORED) || (bVar15)) || (bVar16)) ||
         (iVar11 = strncmp(equed,"N",1), iVar11 == 0)) {
        if (bVar15) {
          panel_size = (int)colcnd;
          relax = 0;
          for (amax = 0.0; (int)amax < A->nrow; amax = (float)((int)amax + 1)) {
            if (R[(int)amax] <= (float)panel_size) {
              local_130 = R[(int)amax];
            }
            else {
              local_130 = (float)panel_size;
            }
            panel_size = (int)local_130;
            if ((float)relax < R[(int)amax] || (float)relax == R[(int)amax]) {
              local_134 = R[(int)amax];
            }
            else {
              local_134 = (float)relax;
            }
            relax = (int)local_134;
          }
          if (0.0 < (float)panel_size) {
            if (A->nrow < 1) {
              rcmin = 1.0;
            }
            else {
              if ((float)panel_size <= rowcnd) {
                local_138 = rowcnd;
              }
              else {
                local_138 = (float)panel_size;
              }
              if (colcnd <= (float)relax) {
                local_140 = colcnd;
              }
              else {
                local_140 = (float)relax;
              }
              rcmin = local_138 / local_140;
            }
          }
          else {
            *info = -7;
          }
        }
        if ((bVar16) && (*info == 0)) {
          panel_size = (int)colcnd;
          relax = 0;
          for (amax = 0.0; (int)amax < A->nrow; amax = (float)((int)amax + 1)) {
            if (C[(int)amax] <= (float)panel_size) {
              local_144 = C[(int)amax];
            }
            else {
              local_144 = (float)panel_size;
            }
            panel_size = (int)local_144;
            if ((float)relax < C[(int)amax] || (float)relax == C[(int)amax]) {
              local_148 = C[(int)amax];
            }
            else {
              local_148 = (float)relax;
            }
            relax = (int)local_148;
          }
          if (0.0 < (float)panel_size) {
            if (A->nrow < 1) {
              rcmax = 1.0;
            }
            else {
              if ((float)panel_size <= rowcnd) {
                local_14c = rowcnd;
              }
              else {
                local_14c = (float)panel_size;
              }
              if (colcnd <= (float)relax) {
                local_154 = colcnd;
              }
              else {
                local_154 = (float)relax;
              }
              rcmax = local_14c / local_154;
            }
          }
          else {
            *info = -8;
          }
        }
        if (*info == 0) {
          if (lwork < -1) {
            *info = -0xc;
          }
          else if (B->ncol < 0) {
            *info = -0xd;
          }
          else if (0 < B->ncol) {
            if (A->nrow < 0) {
              local_15c = 0;
            }
            else {
              local_15c = A->nrow;
            }
            if (((*piVar5 < local_15c) || (B->Stype != SLU_DN)) ||
               ((B->Dtype != SLU_C || (B->Mtype != SLU_GE)))) {
              *info = -0xd;
            }
          }
          if (X->ncol < 0) {
            *info = -0xe;
          }
          else if (0 < X->ncol) {
            if (A->nrow < 0) {
              local_164 = 0;
            }
            else {
              local_164 = A->nrow;
            }
            if (((*piVar6 < local_164) ||
                (((B->ncol != 0 && (B->ncol != X->ncol)) || (X->Stype != SLU_DN)))) ||
               ((X->Dtype != SLU_C || (X->Mtype != SLU_GE)))) {
              *info = -0xe;
            }
          }
        }
      }
      else {
        *info = -6;
      }
    }
    else {
      *info = -2;
    }
  }
  else {
    *info = -1;
  }
  if (*info == 0) {
    iVar11 = sp_ienv(1);
    relax_00 = sp_ienv(2);
    pdVar9 = stat->utime;
    if (A->Stype == SLU_NR) {
      piVar10 = (int_t *)A->Store;
      AC.Store = superlu_malloc(0x20);
      cCreate_CompCol_Matrix
                ((SuperMatrix *)AC.Store,A->ncol,A->nrow,*piVar10,*(singlecomplex **)(piVar10 + 2),
                 *(int_t **)(piVar10 + 4),*(int_t **)(piVar10 + 6),SLU_NC,A->Dtype,A->Mtype);
      bVar14 = !bVar14;
      i = (int)!bVar14;
    }
    else {
      i = options->Trans;
      AC.Store = A;
    }
    if ((bVar13) && (yVar4 == YES)) {
      dVar19 = SuperLU_timer_();
      cgsequ((SuperMatrix *)AC.Store,R,C,&rcmin,&rcmax,&bignum,(int *)&anorm);
      if (anorm == 0.0) {
        claqgs((SuperMatrix *)AC.Store,R,C,rcmin,rcmax,bignum,equed);
        iVar12 = strncmp(equed,"R",1);
        bVar15 = true;
        if (iVar12 != 0) {
          iVar12 = strncmp(equed,"B",1);
          bVar15 = iVar12 == 0;
        }
        iVar12 = strncmp(equed,"C",1);
        bVar16 = true;
        if (iVar12 != 0) {
          iVar12 = strncmp(equed,"B",1);
          bVar16 = iVar12 == 0;
        }
      }
      dVar20 = SuperLU_timer_();
      pdVar9[4] = dVar20 - dVar19;
    }
    if (bVar13) {
      dVar19 = SuperLU_timer_();
      cStack_d0 = options->ColPerm;
      if ((cStack_d0 != MY_PERMC) && (options->Fact == DOFACT)) {
        get_perm_c(cStack_d0,(SuperMatrix *)AC.Store,perm_c);
      }
      dVar20 = SuperLU_timer_();
      *pdVar9 = dVar20 - dVar19;
      dVar19 = SuperLU_timer_();
      sp_preorder(options,(SuperMatrix *)AC.Store,perm_c,etree,(SuperMatrix *)&equil);
      dVar20 = SuperLU_timer_();
      pdVar9[3] = dVar20 - dVar19;
      dVar19 = SuperLU_timer_();
      cgstrf(options,(SuperMatrix *)&equil,relax_00,iVar11,etree,work,lwork,perm_c,perm_r,L,U,Glu,
             stat,info);
      dVar20 = SuperLU_timer_();
      pdVar9[7] = dVar20 - dVar19;
      if (lwork == -1) {
        mem_usage->total_needed = (float)(*info - A->ncol);
        return;
      }
    }
    if (*info < 1) {
      if (options->PivotGrowth != NO) {
        fVar17 = cPivotGrowth(A->ncol,(SuperMatrix *)AC.Store,perm_c,L,U);
        *recip_pivot_growth = fVar17;
      }
      if (options->ConditionNumber != NO) {
        dVar19 = SuperLU_timer_();
        if (bVar14) {
          j._3_1_ = 0x31;
        }
        else {
          j._3_1_ = 0x49;
        }
        smlnum = clangs((char *)((long)&j + 3),(SuperMatrix *)AC.Store);
        cgscon((char *)((long)&j + 3),L,U,smlnum,rcond,stat,(int *)&anorm);
        dVar20 = SuperLU_timer_();
        pdVar9[0x10] = dVar20 - dVar19;
      }
      if (0 < iVar3) {
        if (bVar14) {
          if (bVar15) {
            for (amax = 0.0; (int)amax < iVar3; amax = (float)((int)amax + 1)) {
              for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
                *(float *)(lVar7 + (long)(info1 + (int)amax * iVar1) * 8) =
                     *(float *)(lVar7 + (long)(info1 + (int)amax * iVar1) * 8) * R[info1];
                *(float *)(lVar7 + 4 + (long)(info1 + (int)amax * iVar1) * 8) =
                     *(float *)(lVar7 + 4 + (long)(info1 + (int)amax * iVar1) * 8) * R[info1];
              }
            }
          }
        }
        else if (bVar16) {
          for (amax = 0.0; (int)amax < iVar3; amax = (float)((int)amax + 1)) {
            for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
              *(float *)(lVar7 + (long)(info1 + (int)amax * iVar1) * 8) =
                   *(float *)(lVar7 + (long)(info1 + (int)amax * iVar1) * 8) * C[info1];
              *(float *)(lVar7 + 4 + (long)(info1 + (int)amax * iVar1) * 8) =
                   *(float *)(lVar7 + 4 + (long)(info1 + (int)amax * iVar1) * 8) * C[info1];
            }
          }
        }
        for (amax = 0.0; (int)amax < iVar3; amax = (float)((int)amax + 1)) {
          for (info1 = 0; info1 < B->nrow; info1 = info1 + 1) {
            *(undefined8 *)(lVar8 + (long)(info1 + (int)amax * iVar2) * 8) =
                 *(undefined8 *)(lVar7 + (long)(info1 + (int)amax * iVar1) * 8);
          }
        }
        dVar19 = SuperLU_timer_();
        cgstrs(i,L,U,perm_c,perm_r,X,stat,(int *)&anorm);
        dVar20 = SuperLU_timer_();
        pdVar9[0x11] = dVar20 - dVar19;
        dVar19 = SuperLU_timer_();
        if (options->IterRefine == NOREFINE) {
          for (amax = 0.0; (int)amax < iVar3; amax = (float)((int)amax + 1)) {
            berr[(int)amax] = 1.0;
            ferr[(int)amax] = 1.0;
          }
        }
        else {
          cgsrfs(i,(SuperMatrix *)AC.Store,L,U,perm_c,perm_r,equed,R,C,B,X,ferr,berr,stat,
                 (int *)&anorm);
        }
        dVar20 = SuperLU_timer_();
        pdVar9[0x12] = dVar20 - dVar19;
        if (bVar14) {
          if (bVar16) {
            for (amax = 0.0; (int)amax < iVar3; amax = (float)((int)amax + 1)) {
              for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
                *(float *)(lVar8 + (long)(info1 + (int)amax * iVar2) * 8) =
                     *(float *)(lVar8 + (long)(info1 + (int)amax * iVar2) * 8) * C[info1];
                *(float *)(lVar8 + 4 + (long)(info1 + (int)amax * iVar2) * 8) =
                     *(float *)(lVar8 + 4 + (long)(info1 + (int)amax * iVar2) * 8) * C[info1];
              }
            }
          }
        }
        else if (bVar15) {
          for (amax = 0.0; (int)amax < iVar3; amax = (float)((int)amax + 1)) {
            for (info1 = 0; info1 < A->nrow; info1 = info1 + 1) {
              *(float *)(lVar8 + (long)(info1 + (int)amax * iVar2) * 8) =
                   *(float *)(lVar8 + (long)(info1 + (int)amax * iVar2) * 8) * R[info1];
              *(float *)(lVar8 + 4 + (long)(info1 + (int)amax * iVar2) * 8) =
                   *(float *)(lVar8 + 4 + (long)(info1 + (int)amax * iVar2) * 8) * R[info1];
            }
          }
        }
      }
      if ((options->ConditionNumber != NO) &&
         (fVar17 = *rcond, fVar18 = smach("E"), fVar17 < fVar18)) {
        *info = A->ncol + 1;
      }
      if (bVar13) {
        cQuerySpace(L,U,mem_usage);
        Destroy_CompCol_Permuted((SuperMatrix *)&equil);
      }
      if (A->Stype == SLU_NR) {
        Destroy_SuperMatrix_Store((SuperMatrix *)AC.Store);
        superlu_free(AC.Store);
      }
    }
    else if (*info <= A->ncol) {
      fVar17 = cPivotGrowth(*info,(SuperMatrix *)AC.Store,perm_c,L,U);
      *recip_pivot_growth = fVar17;
    }
  }
  else {
    info1 = -*info;
    input_error("cgssvx",&info1);
  }
  return;
}

Assistant:

void
cgssvx(superlu_options_t *options, SuperMatrix *A, int *perm_c, int *perm_r,
       int *etree, char *equed, float *R, float *C,
       SuperMatrix *L, SuperMatrix *U, void *work, int_t lwork,
       SuperMatrix *B, SuperMatrix *X, float *recip_pivot_growth, 
       float *rcond, float *ferr, float *berr, 
       GlobalLU_t *Glu, mem_usage_t *mem_usage, SuperLUStat_t *stat, int_t *info )
{

    DNformat  *Bstore, *Xstore;
    singlecomplex    *Bmat, *Xmat;
    int       ldb, ldx, nrhs;
    SuperMatrix *AA;/* A in SLU_NC format used by the factorization routine.*/
    SuperMatrix AC; /* Matrix postmultiplied by Pc */
    int       colequ, equil, nofact, notran, rowequ, permc_spec;
    trans_t   trant;
    char      norm[1];
    int       i, j, info1;
    float    amax, anorm, bignum, smlnum, colcnd, rowcnd, rcmax, rcmin;
    int       relax, panel_size;
    double    t0;      /* temporary time */
    double    *utime;

    /* External functions */
    extern float clangs(char *, SuperMatrix *);

    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;

    *info = 0;
    nofact = (options->Fact != FACTORED);
    equil = (options->Equil == YES);
    notran = (options->Trans == NOTRANS);
    if ( nofact ) {
	*(unsigned char *)equed = 'N';
	rowequ = FALSE;
	colequ = FALSE;
    } else {
	rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	smlnum = smach("Safe minimum");   /* lamch_("Safe minimum"); */
	bignum = 1. / smlnum;
    }

#if 0
printf("dgssvx: Fact=%4d, Trans=%4d, equed=%c\n",
       options->Fact, options->Trans, *equed);
#endif

    /* Test the input parameters */
    if ( (options->Fact != DOFACT && options->Fact != SamePattern &&
	  options->Fact != SamePattern_SameRowPerm &&
	  options->Fact != FACTORED) || 
	 (options->Trans != NOTRANS && options->Trans != TRANS && 
	  options->Trans != CONJ) ||
	 (options->Equil != NO && options->Equil != YES) )
	 *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      (A->Stype != SLU_NC && A->Stype != SLU_NR) ||
	      A->Dtype != SLU_C || A->Mtype != SLU_GE )
	*info = -2;
    else if ( options->Fact == FACTORED &&
	     !(rowequ || colequ || strncmp(equed, "N", 1)==0) )
	*info = -6;
    else {
	if (rowequ) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, R[j]);
		rcmax = SUPERLU_MAX(rcmax, R[j]);
	    }
	    if (rcmin <= 0.) *info = -7;
	    else if ( A->nrow > 0)
		rowcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else rowcnd = 1.;
	}
	if (colequ && *info == 0) {
	    rcmin = bignum;
	    rcmax = 0.;
	    for (j = 0; j < A->nrow; ++j) {
		rcmin = SUPERLU_MIN(rcmin, C[j]);
		rcmax = SUPERLU_MAX(rcmax, C[j]);
	    }
	    if (rcmin <= 0.) *info = -8;
	    else if (A->nrow > 0)
		colcnd = SUPERLU_MAX(rcmin,smlnum) / SUPERLU_MIN(rcmax,bignum);
	    else colcnd = 1.;
	}
	if (*info == 0) {
	    if ( lwork < -1 ) *info = -12;
	    else if ( B->ncol < 0 ) *info = -13;
	    else if ( B->ncol > 0 ) { /* no checking if B->ncol=0 */
	         if ( Bstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      B->Stype != SLU_DN || B->Dtype != SLU_C || 
		      B->Mtype != SLU_GE )
		*info = -13;
            }
	    if ( X->ncol < 0 ) *info = -14;
            else if ( X->ncol > 0 ) { /* no checking if X->ncol=0 */
                 if ( Xstore->lda < SUPERLU_MAX(0, A->nrow) ||
		      (B->ncol != 0 && B->ncol != X->ncol) ||
                      X->Stype != SLU_DN ||
		      X->Dtype != SLU_C || X->Mtype != SLU_GE )
		*info = -14;
            }
	}
    }
    if (*info != 0) {
	i = -(*info);
	input_error("cgssvx", &i);
	return;
    }
    
    /* Initialization for factor parameters */
    panel_size = sp_ienv(1);
    relax      = sp_ienv(2);

    utime = stat->utime;
    
    /* Convert A to SLU_NC format when necessary. */
    if ( A->Stype == SLU_NR ) {
	NRformat *Astore = A->Store;
	AA = (SuperMatrix *) SUPERLU_MALLOC( sizeof(SuperMatrix) );
	cCreate_CompCol_Matrix(AA, A->ncol, A->nrow, Astore->nnz, 
			       Astore->nzval, Astore->colind, Astore->rowptr,
			       SLU_NC, A->Dtype, A->Mtype);
	if ( notran ) { /* Reverse the transpose argument. */
	    trant = TRANS;
	    notran = 0;
	} else {
	    trant = NOTRANS;
	    notran = 1;
	}
    } else { /* A->Stype == SLU_NC */
	trant = options->Trans;
	AA = A;
    }

    if ( nofact && equil ) {
	t0 = SuperLU_timer_();
	/* Compute row and column scalings to equilibrate the matrix A. */
	cgsequ(AA, R, C, &rowcnd, &colcnd, &amax, &info1);
	
	if ( info1 == 0 ) {
	    /* Equilibrate matrix A. */
	    claqgs(AA, R, C, rowcnd, colcnd, amax, equed);
	    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
	    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
	}
	utime[EQUIL] = SuperLU_timer_() - t0;
    }


    if ( nofact ) {
	
        t0 = SuperLU_timer_();
	/*
	 * Gnet column permutation vector perm_c[], according to permc_spec:
	 *   permc_spec = NATURAL:  natural ordering 
	 *   permc_spec = MMD_AT_PLUS_A: minimum degree on structure of A'+A
	 *   permc_spec = MMD_ATA:  minimum degree on structure of A'*A
	 *   permc_spec = COLAMD:   approximate minimum degree column ordering
	 *   permc_spec = MY_PERMC: the ordering already supplied in perm_c[]
	 */
	permc_spec = options->ColPerm;
	if ( permc_spec != MY_PERMC && options->Fact == DOFACT )
            get_perm_c(permc_spec, AA, perm_c);
	utime[COLPERM] = SuperLU_timer_() - t0;

	t0 = SuperLU_timer_();
	sp_preorder(options, AA, perm_c, etree, &AC);
	utime[ETREE] = SuperLU_timer_() - t0;
    
/*	printf("Factor PA = LU ... relax %d\tw %d\tmaxsuper %d\trowblk %d\n", 
	       relax, panel_size, sp_ienv(3), sp_ienv(4));
	fflush(stdout); */
	
	/* Compute the LU factorization of A*Pc. */
	t0 = SuperLU_timer_();
	cgstrf(options, &AC, relax, panel_size, etree,
                work, lwork, perm_c, perm_r, L, U, Glu, stat, info);
	utime[FACT] = SuperLU_timer_() - t0;
	
	if ( lwork == -1 ) {
	    mem_usage->total_needed = *info - A->ncol;
	    return;
	}
    }

    if ( *info > 0 ) { 
        if ( *info <= A->ncol ) { /* singular */
	    /* Compute the reciprocal pivot growth factor of the leading
	       rank-deficient (*info) columns of A. */
	    *recip_pivot_growth = cPivotGrowth(*info, AA, perm_c, L, U);
        }
	return;
    }

    /* *info == 0 at this point. */

    if ( options->PivotGrowth ) {
        /* Compute the reciprocal pivot growth factor *recip_pivot_growth. */
        *recip_pivot_growth = cPivotGrowth(A->ncol, AA, perm_c, L, U);
    }

    if ( options->ConditionNumber ) {
        /* Estimate the reciprocal of the condition number of A. */
        t0 = SuperLU_timer_();
        if ( notran ) {
	    *(unsigned char *)norm = '1';
        } else {
	    *(unsigned char *)norm = 'I';
        }
        anorm = clangs(norm, AA);
        cgscon(norm, L, U, anorm, rcond, stat, &info1);
        utime[RCOND] = SuperLU_timer_() - t0;
    }
    
    if ( nrhs > 0 ) {
        /* Scale the right hand side if equilibration was performed. */
        if ( notran ) {
	    if ( rowequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], R[i]);
	    }
        } else if ( colequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Bmat[i+j*ldb], &Bmat[i+j*ldb], C[i]);
        }

        /* Compute the solution matrix X. */
        for (j = 0; j < nrhs; j++)  /* Save a copy of the right hand sides */
            for (i = 0; i < B->nrow; i++)
	        Xmat[i + j*ldx] = Bmat[i + j*ldb];
    
        t0 = SuperLU_timer_();
        cgstrs (trant, L, U, perm_c, perm_r, X, stat, &info1);
        utime[SOLVE] = SuperLU_timer_() - t0;
    
        /* Use iterative refinement to improve the computed solution and compute
           error bounds and backward error estimates for it. */
        t0 = SuperLU_timer_();
        if ( options->IterRefine != NOREFINE ) {
            cgsrfs(trant, AA, L, U, perm_c, perm_r, equed, R, C, B,
                   X, ferr, berr, stat, &info1);
        } else {
            for (j = 0; j < nrhs; ++j) ferr[j] = berr[j] = 1.0;
        }
        utime[REFINE] = SuperLU_timer_() - t0;

        /* Transform the solution matrix X to a solution of the original system. */
        if ( notran ) {
	    if ( colequ ) {
	        for (j = 0; j < nrhs; ++j)
		    for (i = 0; i < A->nrow; ++i)
                        cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], C[i]);
	    }
        } else if ( rowequ ) {
	    for (j = 0; j < nrhs; ++j)
	        for (i = 0; i < A->nrow; ++i)
                    cs_mult(&Xmat[i+j*ldx], &Xmat[i+j*ldx], R[i]);
        }
    } /* end if nrhs > 0 */

    if ( options->ConditionNumber ) {
        /* Set INFO = A->ncol+1 if the matrix is singular to working precision. */
        /*if ( *rcond < slamch_("E") ) *info = A->ncol + 1;*/
        if ( *rcond < smach("E") ) *info = A->ncol + 1;
    }

    if ( nofact ) {
        cQuerySpace(L, U, mem_usage);
        Destroy_CompCol_Permuted(&AC);
    }
    if ( A->Stype == SLU_NR ) {
	Destroy_SuperMatrix_Store(AA);
	SUPERLU_FREE(AA);
    }

}